

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qset.h
# Opt level: O0

QSet<QtGraphicsAnchorLayout::AnchorData_*>
operator+(QSet<QtGraphicsAnchorLayout::AnchorData_*> *lhs,
         QSet<QtGraphicsAnchorLayout::AnchorData_*> *rhs)

{
  long lVar1;
  QSet<QtGraphicsAnchorLayout::AnchorData_*> *in_RDX;
  Hash in_RDI;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QSet<QtGraphicsAnchorLayout::AnchorData_*>::QSet
            (in_RDX,(QSet<QtGraphicsAnchorLayout::AnchorData_*> *)in_RDI.d);
  QSet<QtGraphicsAnchorLayout::AnchorData_*>::operator+=
            (in_RDX,(QSet<QtGraphicsAnchorLayout::AnchorData_*> *)in_RDI.d);
  QSet<QtGraphicsAnchorLayout::AnchorData_*>::QSet
            (in_RDX,(QSet<QtGraphicsAnchorLayout::AnchorData_*> *)in_RDI.d);
  QSet<QtGraphicsAnchorLayout::AnchorData_*>::~QSet
            ((QSet<QtGraphicsAnchorLayout::AnchorData_*> *)0x944045);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QSet<QtGraphicsAnchorLayout::AnchorData_*>)(Hash)in_RDI.d;
  }
  __stack_chk_fail();
}

Assistant:

friend QSet operator+(const QSet &lhs, const QSet &rhs) { return QSet(lhs) += rhs; }